

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot.cpp
# Opt level: O2

void ImPlot::AnnotateEx(double x,double y,bool clamp,ImVec4 *col,ImVec2 *off,char *fmt,
                       __va_list_tag *args)

{
  ImPlotContext *pIVar1;
  ImU32 bg;
  ImU32 fg;
  ImVec2 pos;
  
  pIVar1 = GImPlot;
  if (GImPlot->CurrentPlot != (ImPlotPlot *)0x0) {
    pos = PlotToPixels(x,y,-1);
    bg = ImGui::GetColorU32(col);
    if ((col->w != 0.0) || (NAN(col->w))) {
      fg = CalcTextColor(col);
    }
    else {
      fg = GetStyleColorU32(0xc);
    }
    ImPlotAnnotationCollection::AppendV(&pIVar1->Annotations,&pos,off,bg,fg,clamp,fmt,args);
    return;
  }
  __assert_fail("(gp.CurrentPlot != __null) && \"Annotate() needs to be called between BeginPlot() and EndPlot()!\""
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/implot.cpp"
                ,0xae2,
                "void ImPlot::AnnotateEx(double, double, bool, const ImVec4 &, const ImVec2 &, const char *, __va_list_tag *)"
               );
}

Assistant:

void AnnotateEx(double x, double y, bool clamp, const ImVec4& col, const ImVec2& off, const char* fmt, va_list args) {
    ImPlotContext& gp = *GImPlot;
    IM_ASSERT_USER_ERROR(gp.CurrentPlot != NULL, "Annotate() needs to be called between BeginPlot() and EndPlot()!");
    ImVec2 pos = PlotToPixels(x,y);
    ImU32  bg  = ImGui::GetColorU32(col);
    ImU32  fg  = col.w == 0 ? GetStyleColorU32(ImPlotCol_InlayText) : CalcTextColor(col);
    gp.Annotations.AppendV(pos, off, bg, fg, clamp, fmt, args);
}